

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

int lws_sql_purify_len(char *p)

{
  int iVar1;
  char cVar2;
  char *pcVar3;
  
  cVar2 = *p;
  if (cVar2 != '\0') {
    pcVar3 = p + 1;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (uint)(cVar2 == '\'') + 1;
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
    return iVar1;
  }
  return 0;
}

Assistant:

int
lws_sql_purify_len(const char *p)
{
	int olen = 0;

	while (*p) {
		if (*p++ == '\'')
			olen++;
		olen++;
	}

	return olen;
}